

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O1

AC3ParseError __thiscall AC3Codec::parseHeader(AC3Codec *this,uint8_t *buf,uint8_t *end)

{
  uint8_t *buf_00;
  ushort uVar1;
  uint8_t uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar7;
  byte bVar8;
  uint8_t uVar9;
  int iVar10;
  uint num;
  char cVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  BitStreamReader gbc;
  BitStreamReader local_68;
  uint local_48;
  undefined4 local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (*buf != '\v') {
    return SYNC;
  }
  if (buf[1] != 'w') {
    return SYNC;
  }
  bVar14 = buf[5];
  if (0x87 < bVar14) {
    return BSID;
  }
  buf_00 = buf + 2;
  this->m_bsid = bVar14 >> 3;
  if (bVar14 < 0x58) {
    bVar14 = buf[4] >> 6;
    this->m_fscod = bVar14;
    if (bVar14 == 3) {
      return SAMPLE_RATE;
    }
    uVar6 = buf[4] & 0x3f;
    this->m_frmsizecod = uVar6;
    if (0x25 < (byte)uVar6) {
      return FRAME_SIZE;
    }
    uVar6 = (uint)ff_ac3_frame_sizes[uVar6][(uint)bVar14] * 2;
    this->m_frame_size = uVar6;
    if (end + 2 < buf_00 + uVar6) {
      return NOT_ENOUGH_BUFFER;
    }
    bVar3 = crc32(buf_00,uVar6 - 4);
    if (bVar3) {
      local_68.super_BitStream.m_totalBits = 0;
      local_68.super_BitStream.m_buffer = (uint *)0x0;
      local_68.super_BitStream.m_initBuffer = (uint *)0x0;
      local_68.m_curVal = 0;
      local_68.m_bitLeft = 0;
      BitStreamReader::setBuffer(&local_68,buf + 5,end);
      this->m_bsidBase = this->m_bsid;
      this->m_strmtyp = '\x02';
      this->m_samples = 0x600;
      BitStreamReader::skipBits(&local_68,5);
      uVar6 = BitStreamReader::getBits(&local_68,3);
      this->m_bsmod = (uint8_t)uVar6;
      uVar6 = BitStreamReader::getBits(&local_68,3);
      this->m_acmod = (uint8_t)uVar6;
      if ((uint8_t)uVar6 != '\x01' && (uVar6 & 1) != 0) {
        BitStreamReader::skipBits(&local_68,2);
      }
      if ((this->m_acmod & 4) != 0) {
        BitStreamReader::skipBits(&local_68,2);
      }
      if (this->m_acmod == '\x02') {
        uVar6 = BitStreamReader::getBits(&local_68,2);
        this->m_dsurmod = (uint8_t)uVar6;
      }
      uVar6 = BitStreamReader::getBits(&local_68,1);
      this->m_lfeon = (uint8_t)uVar6;
      bVar14 = this->m_bsid - 8;
      if (this->m_bsid < 8) {
        bVar14 = 0;
      }
      this->m_halfratecod = bVar14;
      this->m_sample_rate = (uint)(ff_ac3_freqs[this->m_fscod] >> (bVar14 & 0x1f));
      this->m_bit_rate = (uint)ff_ac3_bitratetab[this->m_frmsizecod >> 1] * 1000 >> (bVar14 & 0x1f);
      this->m_channels = (uint8_t)uVar6 + "\x02\x01\x02\x03\x03\x04\x04\x05"[this->m_acmod];
      return NO_ERROR;
    }
    return CRC2;
  }
  iVar5 = (buf[2] & 7) * 0x200;
  uVar6 = iVar5 + (uint)buf[3] * 2;
  uVar7 = iVar5 + (uint)buf[3] * 2 + 2;
  this->m_frame_size = uVar7;
  if (uVar6 < 5) {
    return FRAME_SIZE;
  }
  if (end + 2 < buf_00 + uVar7) {
    return NOT_ENOUGH_BUFFER;
  }
  bVar3 = crc32(buf_00,uVar6 - 2);
  if (!bVar3) {
    return CRC2;
  }
  local_68.super_BitStream.m_totalBits = 0;
  local_68.super_BitStream.m_buffer = (uint *)0x0;
  local_68.super_BitStream.m_initBuffer = (uint *)0x0;
  local_68.m_curVal = 0;
  local_68.m_bitLeft = 0;
  BitStreamReader::setBuffer(&local_68,buf_00,end);
  uVar6 = BitStreamReader::getBits(&local_68,2);
  this->m_strmtyp = (uint8_t)uVar6;
  if ((uint8_t)uVar6 == '\x03') {
    return SYNC;
  }
  BitStreamReader::skipBits(&local_68,0xe);
  uVar6 = BitStreamReader::getBits(&local_68,2);
  uVar7 = BitStreamReader::getBits(&local_68,2);
  uVar12 = (ulong)uVar7;
  if ((char)uVar6 == '\x03') {
    if ((char)uVar7 == '\x03') {
      return SYNC;
    }
    uVar1 = ff_ac3_freqs[uVar7 & 0xff] >> 1;
    uVar12 = CONCAT71((uint7)(uint3)(uVar7 >> 8),3);
  }
  else {
    uVar1 = ff_ac3_freqs[uVar6 & 0xff];
  }
  this->m_sample_rate = (uint)uVar1;
  cVar11 = (char)uVar12;
  if (cVar11 == '\0') {
    iVar5 = 1;
  }
  else {
    iVar5 = 2;
    if (cVar11 != '\x01') {
      iVar5 = (uint)(cVar11 != '\x02') * 3 + 3;
    }
  }
  local_34 = uVar6;
  uVar6 = BitStreamReader::getBits(&local_68,3);
  local_38 = BitStreamReader::getBits(&local_68,1);
  bVar14 = "\x01\x02\x03\x06"[uVar12 & 0xff];
  this->m_samples = (uint)bVar14 << 8;
  this->m_bit_rateExt = (this->m_frame_size * this->m_sample_rate * 8) / (int)((uint)bVar14 << 8);
  BitStreamReader::skipBits(&local_68,5);
  iVar10 = 0;
  do {
    BitStreamReader::skipBits(&local_68,5);
    bVar3 = BitStreamReader::getBit(&local_68);
    if (bVar3) {
      BitStreamReader::skipBits(&local_68,8);
    }
    bVar3 = iVar10 == 0;
    iVar10 = iVar10 + -1;
    bVar14 = (byte)uVar6;
  } while ((bVar14 == 0) && (bVar3));
  if ((this->m_strmtyp == '\x01') &&
     ((bVar3 = BitStreamReader::getBit(&local_68), bVar3 &&
      (uVar7 = BitStreamReader::getBits(&local_68,0x10), (uVar7 & 0x7fe0) != 0)))) {
    this->m_extChannelsExists = true;
  }
  bVar3 = BitStreamReader::getBit(&local_68);
  bVar8 = 0;
  bVar4 = false;
  local_44 = 0;
  local_48 = 0;
  local_3c = (uint)uVar12;
  if (bVar3) {
    if (2 < bVar14) {
      BitStreamReader::skipBits(&local_68,2);
    }
    if ((uVar6 & 1) != 0 && 2 < bVar14) {
      BitStreamReader::skipBits(&local_68,6);
    }
    if ((uVar6 & 4) != 0) {
      BitStreamReader::skipBits(&local_68,6);
    }
    if (((char)local_38 != '\0') && (bVar3 = BitStreamReader::getBit(&local_68), bVar3)) {
      BitStreamReader::skipBits(&local_68,5);
    }
    bVar8 = 0;
    bVar4 = false;
    local_44 = 0;
    local_48 = 0;
    if (this->m_strmtyp == '\0') {
      bVar3 = BitStreamReader::getBit(&local_68);
      uVar7 = (uint)CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        BitStreamReader::skipBits(&local_68,6);
      }
      if ((bVar14 == 0) && (bVar3 = BitStreamReader::getBit(&local_68), bVar3)) {
        BitStreamReader::skipBits(&local_68,6);
      }
      bVar3 = BitStreamReader::getBit(&local_68);
      local_44 = (undefined4)CONCAT71(extraout_var_00,bVar3);
      if (bVar3) {
        BitStreamReader::skipBits(&local_68,6);
      }
      local_48 = BitStreamReader::getBits(&local_68,2);
      if ((char)local_48 == '\x01') {
        num = 5;
LAB_00175dc4:
        BitStreamReader::skipBits(&local_68,num);
      }
      else if ((local_48 & 0xff) == 3) {
        local_40 = uVar7;
        uVar7 = BitStreamReader::getBits(&local_68,5);
        bVar3 = BitStreamReader::getBit(&local_68);
        if (bVar3) {
          BitStreamReader::skipBits(&local_68,5);
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,4);
          }
          bVar3 = BitStreamReader::getBit(&local_68);
          uVar12 = (ulong)local_3c;
          if (bVar3) {
            bVar3 = BitStreamReader::getBit(&local_68);
            if (bVar3) {
              BitStreamReader::skipBits(&local_68,4);
            }
            bVar3 = BitStreamReader::getBit(&local_68);
            uVar12 = (ulong)local_3c;
            if (bVar3) {
              BitStreamReader::skipBits(&local_68,4);
            }
          }
        }
        bVar3 = BitStreamReader::getBit(&local_68);
        if (bVar3) {
          BitStreamReader::skipBits(&local_68,5);
          bVar3 = BitStreamReader::getBit(&local_68);
          if (bVar3) {
            BitStreamReader::skipBits(&local_68,7);
            bVar3 = BitStreamReader::getBit(&local_68);
            if (bVar3) {
              BitStreamReader::skipBits(&local_68,7);
            }
          }
        }
        iVar10 = (uVar7 & 0xff) + 2;
        do {
          BitStreamReader::skipBits(&local_68,8);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        uVar7 = local_40;
        if ((local_68._24_8_ & 0x700000000) != 0) {
          num = 8 - (local_68.m_bitLeft & 7);
          goto LAB_00175dc4;
        }
      }
      else if ((local_48 & 0xff) == 2) {
        num = 0xc;
        goto LAB_00175dc4;
      }
      bVar8 = (byte)uVar7;
      if (bVar14 < 2) {
        bVar4 = BitStreamReader::getBit(&local_68);
        if (bVar4) {
          BitStreamReader::skipBits(&local_68,0xe);
        }
        if ((bVar14 == 0) && (bVar3 = BitStreamReader::getBit(&local_68), bVar3)) {
          BitStreamReader::skipBits(&local_68,0xe);
        }
      }
      else {
        bVar4 = false;
      }
      bVar3 = BitStreamReader::getBit(&local_68);
      if (bVar3) {
        if ((char)uVar12 == '\0') {
          BitStreamReader::skipBits(&local_68,5);
        }
        else {
          do {
            bVar3 = BitStreamReader::getBit(&local_68);
            if (bVar3) {
              BitStreamReader::skipBits(&local_68,5);
            }
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
    }
  }
  bVar3 = BitStreamReader::getBit(&local_68);
  if (!bVar3) {
    uVar9 = '\0';
    local_40 = 0;
    bVar13 = (byte)local_34;
    goto LAB_00175f1f;
  }
  local_40 = BitStreamReader::getBits(&local_68,3);
  BitStreamReader::skipBits(&local_68,2);
  bVar13 = (byte)local_34;
  if (bVar14 == 2) {
    uVar7 = BitStreamReader::getBits(&local_68,2);
    uVar2 = (uint8_t)uVar7;
LAB_00175ecd:
    uVar9 = uVar2;
    BitStreamReader::skipBits(&local_68,2);
  }
  else {
    uVar9 = '\0';
    uVar2 = '\0';
    if (5 < bVar14) goto LAB_00175ecd;
  }
  bVar3 = BitStreamReader::getBit(&local_68);
  if (bVar3) {
    BitStreamReader::skipBits(&local_68,8);
  }
  if ((bVar14 == 0) && (bVar3 = BitStreamReader::getBit(&local_68), bVar3)) {
    BitStreamReader::skipBits(&local_68,8);
  }
  if (bVar13 < 3) {
    BitStreamReader::skipBit(&local_68);
  }
LAB_00175f1f:
  if (((char)local_3c != '\x03') && (this->m_strmtyp == '\0')) {
    BitStreamReader::skipBit(&local_68);
  }
  if ((this->m_strmtyp == '\x02') &&
     (((char)local_3c == '\x03' || (bVar3 = BitStreamReader::getBit(&local_68), bVar3)))) {
    BitStreamReader::skipBits(&local_68,6);
  }
  bVar3 = BitStreamReader::getBit(&local_68);
  if ((((bVar3) && (uVar7 = BitStreamReader::getBits(&local_68,6), uVar7 == 1)) &&
      (uVar7 = BitStreamReader::getBits(&local_68,8), uVar7 == 1)) &&
     (uVar7 = BitStreamReader::getBits(&local_68,8), uVar7 < 0x11)) {
    this->m_isAtmos = true;
  }
  this->m_mixinfoexists = (bool)(bVar4 | bVar8 | (byte)local_44 | (char)local_48 != '\0');
  if (this->m_channels == '\0') {
    this->m_acmod = bVar14;
    this->m_lfeon = (uint8_t)local_38;
    this->m_bsmod = (uint8_t)local_40;
    this->m_fscod = bVar13;
    this->m_dsurmod = uVar9;
    this->m_channels = (uint8_t)local_38 + "\x02\x01\x02\x03\x03\x04\x04\x05"[uVar6 & 0xff];
  }
  return NO_ERROR;
}

Assistant:

AC3Codec::AC3ParseError AC3Codec::parseHeader(uint8_t *buf, const uint8_t *end)
{
    if (*buf++ != 0x0B || *buf++ != 0x77)
        return AC3ParseError::SYNC;

    // read ahead to bsid to make sure this is AC-3, not E-AC-3
    const uint8_t id = buf[3] >> 3;
    if (id > 16)
        return AC3ParseError::BSID;

    m_bsid = id;

    // ---------------------------------- EAC3 ------------------------------------------
    if (m_bsid > 10)
    {
        m_frame_size = static_cast<uint16_t>((((buf[0] & 0x07) << 8 | buf[1]) + 1) << 1);
        if (m_frame_size < AC3_HEADER_SIZE)
            return AC3ParseError::FRAME_SIZE;  // invalid header size

        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        uint8_t bsmod = 0, dsurmod = 0, numblkscod, mixdef = 0;
        int extpgmscle, paninfoe;
        int pgmscle = extpgmscle = paninfoe = 0;

        BitStreamReader gbc{};
        gbc.setBuffer(buf, end);

        m_strmtyp = gbc.getBits<uint8_t>(2);
        if (m_strmtyp == 3)
            return AC3ParseError::SYNC;  // invalid stream type

        gbc.skipBits(14);  // substreamid, frmsize

        const auto fscod = gbc.getBits<uint8_t>(2);

        if (fscod == 3)
        {
            const auto m_fscod2 = gbc.getBits<uint8_t>(2);
            if (m_fscod2 == 3)
                return AC3ParseError::SYNC;

            numblkscod = 3;
            m_sample_rate = ff_ac3_freqs[m_fscod2] / 2;
        }
        else
        {
            numblkscod = gbc.getBits<uint8_t>(2);
            m_sample_rate = ff_ac3_freqs[fscod];
        }
        const int number_of_blocks_per_syncframe =
            numblkscod == 0 ? 1 : (numblkscod == 1 ? 2 : (numblkscod == 2 ? 3 : 6));
        const auto acmod = gbc.getBits<uint8_t>(3);
        const auto lfeon = gbc.getBits<uint8_t>(1);

        m_samples = eac3_blocks[numblkscod] << 8;
        m_bit_rateExt = m_frame_size * m_sample_rate * 8 / m_samples;

        gbc.skipBits(5);  // skip bsid, already got it
        for (int i = 0; i < (acmod ? 1 : 2); i++)
        {
            gbc.skipBits(5);  // skip dialog normalization
            if (gbc.getBit())
                gbc.skipBits(8);  // skip Compression gain word
        }

        if (m_strmtyp == 1)  // dependent EAC3 frame
        {
            if (gbc.getBit())
            {
                const auto chanmap = gbc.getBits<int16_t>(16);
                if (chanmap & 0x7fe0)  // mask standard 5.1 channels
                    m_extChannelsExists = true;
            }
        }

        if (gbc.getBit())  // mixing metadata
        {
            if (acmod > 2)
                gbc.skipBits(2);  // dmixmod
            if (acmod & 1 && acmod > 0x2)
                gbc.skipBits(6);  // ltrtcmixlev, lorocmixlev
            if (acmod & 4)
                gbc.skipBits(6);  // ltrtsurmixlev, lorosurmixlev
            if (lfeon && gbc.getBit())
                gbc.skipBits(5);  // lfemixlevcod
            if (m_strmtyp == 0)   // independent EAC3 frame
            {
                pgmscle = gbc.getBit();
                if (pgmscle)
                    gbc.skipBits(6);  // pgmscl
                if (acmod == 0 && gbc.getBit())
                    gbc.skipBits(6);  // pgmscl2
                extpgmscle = gbc.getBit();
                if (extpgmscle)
                    gbc.skipBits(6);  // extpgmscl
                mixdef = gbc.getBits<uint8_t>(2);
                if (mixdef == 1)
                    gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                else if (mixdef == 2)
                    gbc.skipBits(12);  // mixdata
                else if (mixdef == 3)
                {
                    const auto mixdeflen = gbc.getBits<uint8_t>(5);
                    if (gbc.getBit())  // mixdata2e
                    {
                        gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmcscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrsscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlfescl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // dmixscl
                        if (gbc.getBit())     // addch exist
                        {
                            if (gbc.getBit())     // extpgmaux1scl exist
                                gbc.skipBits(4);  // extpgmaux1scl
                            if (gbc.getBit())     // extpgmaux2scl exist
                                gbc.skipBits(4);  // extpgmaux2scl
                        }
                    }
                    if (gbc.getBit())  // mixdata3e
                    {
                        gbc.skipBits(5);   // spchdat
                        if (gbc.getBit())  // addspchdat exist
                        {
                            gbc.skipBits(7);      // spchdat1, spchan1att
                            if (gbc.getBit())     // addspchdat2 exist
                                gbc.skipBits(7);  // spchdat2, spchan2att
                        }
                    }
                    for (int i = 0; i < mixdeflen + 2; i++) gbc.skipBits(8);  // mixdata
                    gbc.alignByte();                                          // mixdatafill
                }
                if (acmod < 2)
                {
                    paninfoe = gbc.getBit();
                    if (paninfoe)
                        gbc.skipBits(14);  // panmean, paninfo
                    if (acmod == 0 && gbc.getBit())
                        gbc.skipBits(14);  // panmean2, paninfo2
                }
                if (gbc.getBit())
                {
                    if (numblkscod == 0)
                        gbc.skipBits(5);  // blkmixcfginfo[0]
                    else
                        for (int blk = 0; blk < number_of_blocks_per_syncframe; blk++)
                            if (gbc.getBit())
                                gbc.skipBits(5);  // blkmixcfginfo[blk]
                }
            }
        }

        if (gbc.getBit()) /* informational metadata */
        {
            bsmod = gbc.getBits<uint8_t>(3);
            gbc.skipBits(2);  // copyrightb, origbs
            if (acmod == 2)
            {
                dsurmod = gbc.getBits<uint8_t>(2);
                gbc.skipBits(2);  // dheadphonmod
            }
            else if (acmod >= 6)  /* if both surround channels exist */
                gbc.skipBits(2);  // dsurexmod
            if (gbc.getBit())     // audprodie
                gbc.skipBits(8);  // mixlevel, roomtype, adconvtyp
            if (acmod == 0)       /* if 1+1 mode (dual mono, so some items need a second value) */
            {
                if (gbc.getBit())     // audprodi2e
                    gbc.skipBits(8);  // mixlevel2, roomtype2, adconvtyp2
            }
            if (fscod < 3)      /* if not half sample rate */
                gbc.skipBit();  // sourcefscod
        }

        if (m_strmtyp == 0 && numblkscod != 3)
            gbc.skipBit();  // convsync

        if (m_strmtyp == 2) /* if bit stream converted from AC-3 */
        {
            if (numblkscod == 3 || gbc.getBit())  // blkid
                gbc.skipBits(6);                  // frmsizecod
        }

        if (gbc.getBit())  // addbsi exist
        {
            if (gbc.getBits(6) == 1)  // addbsi length
            {
                // ETSI TS 103 420 - Backwards-compatible object audio carriage using Enhanced AC-3
                // para. 8.3 Extensions contained in the addbsi bitstream field
                // TODO: conditions below might not be sufficient to detect Atmos
                // ideally, detect payload syncword (but where is it located ?)
                const auto flag_ec3_extension_type_a = gbc.getBits(8) == 1;
                if (flag_ec3_extension_type_a)
                {
                    const auto complexity_index_type_a = gbc.getBits(8);
                    if (complexity_index_type_a <= 16)
                        m_isAtmos = true;
                }
            }
        }

        m_mixinfoexists = pgmscle || extpgmscle || mixdef > 0 || paninfoe;

        if (m_channels == 0)  // no AC3 interleave
        {
            m_acmod = acmod;
            m_lfeon = lfeon;
            m_bsmod = bsmod;
            m_fscod = fscod;
            m_dsurmod = dsurmod;
            m_channels = static_cast<uint8_t>(ff_ac3_channels[acmod] + lfeon);
        }
    }
    // ---------------------------------- AC3 ------------------------------------------
    else
    {
        m_fscod = buf[2] >> 6;
        if (m_fscod == 3)
            return AC3ParseError::SAMPLE_RATE;

        m_frmsizecod = buf[2] & 0x3f;
        if (m_frmsizecod > 37)
            return AC3ParseError::FRAME_SIZE;

        m_frame_size = ff_ac3_frame_sizes[m_frmsizecod][m_fscod] << 1;
        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        BitStreamReader gbc{};
        gbc.setBuffer(buf + 3, end);

        m_bsidBase = m_bsid;  // id except AC3+ frames
        m_strmtyp = 2;
        m_samples = AC3_FRAME_SIZE;

        gbc.skipBits(5);  // skip bsid, already got it
        m_bsmod = gbc.getBits<uint8_t>(3);
        m_acmod = gbc.getBits<uint8_t>(3);
        if ((m_acmod & 1) && m_acmod != AC3_ACMOD_MONO)  // 3 front channels
            gbc.skipBits(2);                             // m_cmixlev
        if (m_acmod & 4)                                 // surround channel exists
            gbc.skipBits(2);                             // m_surmixlev
        if (m_acmod == AC3_ACMOD_STEREO)
            m_dsurmod = gbc.getBits<uint8_t>(2);
        m_lfeon = gbc.getBits<uint8_t>(1);

        m_halfratecod = max(m_bsid, 8) - 8;
        m_sample_rate = ff_ac3_freqs[m_fscod] >> m_halfratecod;
        m_bit_rate = (ff_ac3_bitratetab[m_frmsizecod >> 1] * 1000) >> m_halfratecod;
        m_channels = static_cast<uint8_t>(ff_ac3_channels[m_acmod] + m_lfeon);
    }
    return AC3ParseError::NO_ERROR;
}